

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall Memory::HeapBlockMap64::ResetMarks(HeapBlockMap64 *this)

{
  HeapBlockMap64 HVar1;
  
  while (HVar1.list = this->list, HVar1.list != (Node *)0x0) {
    HeapBlockMap32::ResetMarks(&(HVar1.list)->map);
    this = (HeapBlockMap64 *)&(HVar1.list)->next;
  }
  return;
}

Assistant:

void
HeapBlockMap64::ResetMarks()
{
    Node * node = this->list;
    while (node != nullptr)
    {
        node->map.ResetMarks();
        node = node->next;
    }
}